

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffrsimll(fitsfile *fptr,int bitpix,int naxis,LONGLONG *naxes,int *status)

{
  int iVar1;
  long lVar2;
  fitsfile *fptr_00;
  long lVar3;
  long in_RCX;
  uint in_EDX;
  uint in_ESI;
  int *in_RDI;
  int *in_R8;
  char message [81];
  char keyname [75];
  char comment [73];
  LONGLONG oldsize;
  LONGLONG newsize;
  LONGLONG onaxes [99];
  long longbitpix;
  long gcount;
  long pcount;
  long longval;
  long nblocks;
  int nmodify;
  int extend;
  int onaxis;
  int obitpix;
  int simple;
  int ii;
  int *in_stack_00000688;
  long in_stack_00000690;
  fitsfile *in_stack_00000698;
  int *in_stack_00001250;
  int in_stack_0000125c;
  long in_stack_00001260;
  fitsfile *in_stack_00001268;
  long *status_00;
  char *comm;
  int *piVar4;
  double in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb50;
  uint uVar5;
  long in_stack_fffffffffffffb60;
  char *in_stack_fffffffffffffb68;
  LONGLONG *in_stack_fffffffffffffb78;
  int *in_stack_fffffffffffffb80;
  int *in_stack_fffffffffffffb88;
  int *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  undefined4 in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba4;
  fitsfile *in_stack_fffffffffffffba8;
  int *in_stack_fffffffffffffbc8;
  long *in_stack_fffffffffffffbd0;
  long *in_stack_fffffffffffffbd8;
  int *in_stack_fffffffffffffbe0;
  fitsfile *in_stack_fffffffffffffbe8;
  int *in_stack_fffffffffffffc18;
  char *in_stack_fffffffffffffc20;
  LONGLONG in_stack_fffffffffffffc28;
  int *in_stack_fffffffffffffc30;
  fitsfile *in_stack_fffffffffffffc38;
  long local_398;
  ulong local_390;
  long local_388 [12];
  int *in_stack_fffffffffffffcd8;
  char *in_stack_fffffffffffffce0;
  fitsfile *in_stack_fffffffffffffce8;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  uint local_48;
  char local_44 [4];
  uint local_40;
  int local_3c;
  uint local_34;
  int *local_30;
  long local_28;
  uint local_20;
  uint local_1c;
  int local_c;
  
  if (*in_R8 < 1) {
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_EDX;
    local_1c = in_ESI;
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30), 0 < iVar1)) {
        return *local_30;
      }
    }
    else {
      ffmahd(in_stack_fffffffffffffba8,in_stack_fffffffffffffba4,
             (int *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
             in_stack_fffffffffffffb90);
    }
    status_00 = &local_68;
    comm = local_44;
    piVar4 = local_30;
    iVar1 = ffghprll((fitsfile *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                     in_stack_fffffffffffffb9c,in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                     in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffbd0,
                     in_stack_fffffffffffffbd8,in_stack_fffffffffffffbe0,
                     &in_stack_fffffffffffffbe8->HDUposition);
    if (iVar1 < 1) {
      local_70 = (long)(int)local_1c;
      if (local_70 == 0x14) {
        local_70 = 0x10;
      }
      else if (local_70 == 0x28) {
        local_70 = 0x20;
      }
      else if (local_70 == 10) {
        local_70 = 8;
      }
      else if (local_70 == 0x50) {
        local_70 = 0x40;
      }
      if (((((local_70 == 8) || (local_70 == 0x10)) || (local_70 == 0x20)) ||
          ((local_70 == 0x40 || (local_70 == -0x20)))) || (local_70 == -0x40)) {
        if (((int)local_20 < 0) || (999 < (int)local_20)) {
          snprintf(&stack0xfffffffffffffb68,0x51,"Illegal value for NAXIS keyword: %d",
                   (ulong)local_20);
          ffpmsg((char *)0x12686f);
          *local_30 = 0xd4;
          local_c = 0xd4;
        }
        else {
          local_390 = (ulong)(local_20 != 0);
          for (local_34 = 0; (int)local_34 < (int)local_20; local_34 = local_34 + 1) {
            if (*(long *)(local_28 + (long)(int)local_34 * 8) < 0) {
              snprintf(&stack0xfffffffffffffb68,0x51,"Illegal value for NAXIS%d keyword: %.0f",
                       (double)*(long *)(local_28 + (long)(int)local_34 * 8),(ulong)(local_34 + 1));
              ffpmsg((char *)0x126929);
              *local_30 = 0xd5;
              return 0xd5;
            }
            local_390 = *(long *)(local_28 + (long)(int)local_34 * 8) * local_390;
          }
          if (local_40 == 0) {
            local_398 = 0;
          }
          else {
            local_398 = 1;
            for (local_34 = 0; (int)local_34 < (int)local_40; local_34 = local_34 + 1) {
              local_398 = local_388[(int)local_34] * local_398;
            }
            in_stack_fffffffffffffb60 = (local_398 + local_60) * local_68;
            iVar1 = local_3c;
            if (local_3c < 1) {
              iVar1 = -local_3c;
            }
            local_398 = in_stack_fffffffffffffb60 * (iVar1 / 8);
          }
          lVar2 = (local_398 + 0xb3f) / 0xb40;
          fptr_00 = (fitsfile *)((local_390 + local_60) * local_68);
          lVar3 = local_70;
          if (local_70 < 1) {
            lVar3 = -local_70;
          }
          lVar3 = ((long)fptr_00 * (lVar3 / 8) + 0xb3f) / 0xb40;
          if (lVar2 < lVar3) {
            local_50 = lVar3 - lVar2;
            iVar1 = ffiblk(in_stack_00001268,in_stack_00001260,in_stack_0000125c,in_stack_00001250);
            if (0 < iVar1) {
              return *local_30;
            }
          }
          else if (lVar3 < lVar2) {
            local_50 = lVar2 - lVar3;
            iVar1 = ffdblk(in_stack_00000698,in_stack_00000690,in_stack_00000688);
            if (0 < iVar1) {
              return *local_30;
            }
          }
          strcpy(&stack0xfffffffffffffc18,"&");
          if (local_70 != local_3c) {
            ffmkyj(in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30,
                   in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          }
          if (local_20 != local_40) {
            local_58 = (long)(int)local_20;
            ffmkyj(in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30,
                   in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          }
          uVar5 = local_40;
          if ((int)local_20 < (int)local_40) {
            uVar5 = local_20;
          }
          local_48 = uVar5;
          for (local_34 = 0; iVar1 = (int)((ulong)piVar4 >> 0x20), (int)local_34 < (int)local_48;
              local_34 = local_34 + 1) {
            ffkeyn(in_stack_fffffffffffffb68,(int)((ulong)in_stack_fffffffffffffb60 >> 0x20),
                   (char *)fptr_00,(int *)CONCAT44(uVar5,in_stack_fffffffffffffb50));
            ffmkyj(in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30,
                   in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          }
          if ((int)local_40 < (int)local_20) {
            strcpy(&stack0xfffffffffffffc18,"length of data axis");
            for (local_34 = local_40; iVar1 = (int)((ulong)piVar4 >> 0x20),
                (int)local_34 < (int)local_20; local_34 = local_34 + 1) {
              ffkeyn(in_stack_fffffffffffffb68,(int)((ulong)in_stack_fffffffffffffb60 >> 0x20),
                     (char *)fptr_00,(int *)CONCAT44(uVar5,in_stack_fffffffffffffb50));
              ffikyj(in_stack_fffffffffffffbe8,(char *)in_stack_fffffffffffffbe0,
                     (LONGLONG)in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,
                     in_stack_fffffffffffffbc8);
            }
          }
          else if ((int)local_20 < (int)local_40) {
            for (local_34 = local_20; iVar1 = (int)((ulong)piVar4 >> 0x20),
                (int)local_34 < (int)local_40; local_34 = local_34 + 1) {
              ffkeyn(in_stack_fffffffffffffb68,(int)((ulong)in_stack_fffffffffffffb60 >> 0x20),
                     (char *)fptr_00,(int *)CONCAT44(uVar5,in_stack_fffffffffffffb50));
              ffdkey(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
            }
          }
          if (local_1c == 0x14) {
            strcpy(&stack0xfffffffffffffc18,"offset data range to that of unsigned short");
            ffukyg(fptr_00,(char *)CONCAT44(uVar5,in_stack_fffffffffffffb50),
                   in_stack_fffffffffffffb48,iVar1,comm,(int *)status_00);
            strcpy(&stack0xfffffffffffffc18,"default scaling factor");
            ffukyg(fptr_00,(char *)CONCAT44(uVar5,in_stack_fffffffffffffb50),
                   in_stack_fffffffffffffb48,iVar1,comm,(int *)status_00);
          }
          else if (local_1c == 0x28) {
            strcpy(&stack0xfffffffffffffc18,"offset data range to that of unsigned long");
            ffukyg(fptr_00,(char *)CONCAT44(uVar5,in_stack_fffffffffffffb50),
                   in_stack_fffffffffffffb48,iVar1,comm,(int *)status_00);
            strcpy(&stack0xfffffffffffffc18,"default scaling factor");
            ffukyg(fptr_00,(char *)CONCAT44(uVar5,in_stack_fffffffffffffb50),
                   in_stack_fffffffffffffb48,iVar1,comm,(int *)status_00);
          }
          else if (local_1c == 0x50) {
            strcpy(&stack0xfffffffffffffc18,"offset data range to that of unsigned long long");
            ffukyg(fptr_00,(char *)CONCAT44(uVar5,in_stack_fffffffffffffb50),
                   in_stack_fffffffffffffb48,iVar1,comm,(int *)status_00);
            strcpy(&stack0xfffffffffffffc18,"default scaling factor");
            ffukyg(fptr_00,(char *)CONCAT44(uVar5,in_stack_fffffffffffffb50),
                   in_stack_fffffffffffffb48,iVar1,comm,(int *)status_00);
          }
          else if (local_1c == 10) {
            strcpy(&stack0xfffffffffffffc18,"offset data range to that of signed byte");
            ffukyg(fptr_00,(char *)CONCAT44(uVar5,in_stack_fffffffffffffb50),
                   in_stack_fffffffffffffb48,iVar1,comm,(int *)status_00);
            strcpy(&stack0xfffffffffffffc18,"default scaling factor");
            ffukyg(fptr_00,(char *)CONCAT44(uVar5,in_stack_fffffffffffffb50),
                   in_stack_fffffffffffffb48,iVar1,comm,(int *)status_00);
          }
          ffrdef(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
          local_c = *local_30;
        }
      }
      else {
        snprintf(&stack0xfffffffffffffb68,0x51,"Illegal value for BITPIX keyword: %d",
                 (ulong)local_1c);
        ffpmsg((char *)0x126811);
        *local_30 = 0xd3;
        local_c = 0xd3;
      }
    }
    else {
      local_c = *local_30;
    }
  }
  else {
    local_c = *in_R8;
  }
  return local_c;
}

Assistant:

int ffrsimll(fitsfile *fptr,    /* I - FITS file pointer           */
           int bitpix,          /* I - bits per pixel              */
           int naxis,           /* I - number of axes in the array */
           LONGLONG *naxes,     /* I - size of each axis           */
           int *status)         /* IO - error status               */
/*
   resize an existing primary array or IMAGE extension.
*/
{
    int ii, simple, obitpix, onaxis, extend, nmodify;
    long  nblocks, longval;
    long pcount, gcount, longbitpix;
    LONGLONG onaxes[99], newsize, oldsize;
    char comment[FLEN_COMMENT], keyname[FLEN_KEYWORD], message[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
         /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    /* get current image size parameters */
    if (ffghprll(fptr, 99, &simple, &obitpix, &onaxis, onaxes, &pcount,
               &gcount, &extend, status) > 0)
        return(*status);

    longbitpix = bitpix;

    /* test for the 4 special cases that represent unsigned integers 
       or signed bytes */
    if (longbitpix == USHORT_IMG)
        longbitpix = SHORT_IMG;
    else if (longbitpix == ULONG_IMG)
        longbitpix = LONG_IMG;
    else if (longbitpix == SBYTE_IMG)
        longbitpix = BYTE_IMG;
    else if (longbitpix == ULONGLONG_IMG)
        longbitpix = LONGLONG_IMG;

    /* test that the new values are legal */

    if (longbitpix != BYTE_IMG && longbitpix != SHORT_IMG && 
        longbitpix != LONG_IMG && longbitpix != LONGLONG_IMG &&
        longbitpix != FLOAT_IMG && longbitpix != DOUBLE_IMG)
    {
        snprintf(message, FLEN_ERRMSG,
        "Illegal value for BITPIX keyword: %d", bitpix);
        ffpmsg(message);
        return(*status = BAD_BITPIX);
    }

    if (naxis < 0 || naxis > 999)
    {
        snprintf(message, FLEN_ERRMSG,
        "Illegal value for NAXIS keyword: %d", naxis);
        ffpmsg(message);
        return(*status = BAD_NAXIS);
    }

    if (naxis == 0)
        newsize = 0;
    else
        newsize = 1;

    for (ii = 0; ii < naxis; ii++)
    {
        if (naxes[ii] < 0)
        {
            snprintf(message, FLEN_ERRMSG,
            "Illegal value for NAXIS%d keyword: %.0f", ii + 1,  (double) (naxes[ii]));
            ffpmsg(message);
            return(*status = BAD_NAXES);
        }

        newsize *= naxes[ii];  /* compute new image size, in pixels */
    }

    /* compute size of old image, in bytes */

    if (onaxis == 0)
        oldsize = 0;
    else
    {
        oldsize = 1;
        for (ii = 0; ii < onaxis; ii++)
            oldsize *= onaxes[ii];  
        oldsize = (oldsize + pcount) * gcount * (abs(obitpix) / 8);
    }

    oldsize = (oldsize + 2879) / 2880; /* old size, in blocks */

    newsize = (newsize + pcount) * gcount * (labs(longbitpix) / 8);
    newsize = (newsize + 2879) / 2880; /* new size, in blocks */

    if (newsize > oldsize)   /* have to insert new blocks for image */
    {
        nblocks = (long) (newsize - oldsize);
        if (ffiblk(fptr, nblocks, 1, status) > 0)  
            return(*status);
    }
    else if (oldsize > newsize)  /* have to delete blocks from image */
    {
        nblocks = (long) (oldsize - newsize);
        if (ffdblk(fptr, nblocks, status) > 0)  
            return(*status);
    }

    /* now update the header keywords */

    strcpy(comment,"&");  /* special value to leave comments unchanged */

    if (longbitpix != obitpix)
    {                         /* update BITPIX value */
        ffmkyj(fptr, "BITPIX", longbitpix, comment, status);
    }

    if (naxis != onaxis)
    {                        /* update NAXIS value */
        longval = naxis;
        ffmkyj(fptr, "NAXIS", longval, comment, status);
    }

    /* modify the existing NAXISn keywords */
    nmodify = minvalue(naxis, onaxis); 
    for (ii = 0; ii < nmodify; ii++)
    {
        ffkeyn("NAXIS", ii+1, keyname, status);
        ffmkyj(fptr, keyname, naxes[ii], comment, status);
    }

    if (naxis > onaxis)  /* insert additional NAXISn keywords */
    {
        strcpy(comment,"length of data axis");  
        for (ii = onaxis; ii < naxis; ii++)
        {
            ffkeyn("NAXIS", ii+1, keyname, status);
            ffikyj(fptr, keyname, naxes[ii], comment, status);
        }
    }
    else if (onaxis > naxis) /* delete old NAXISn keywords */
    {
        for (ii = naxis; ii < onaxis; ii++)
        {
            ffkeyn("NAXIS", ii+1, keyname, status);
            ffdkey(fptr, keyname, status);
        }
    }

    /* Update the BSCALE and BZERO keywords, if an unsigned integer image
       or a signed byte image.  */
    if (bitpix == USHORT_IMG)
    {
        strcpy(comment, "offset data range to that of unsigned short");
        ffukyg(fptr, "BZERO", 32768., 0, comment, status);
        strcpy(comment, "default scaling factor");
        ffukyg(fptr, "BSCALE", 1.0, 0, comment, status);
    }
    else if (bitpix == ULONG_IMG)
    {
        strcpy(comment, "offset data range to that of unsigned long");
        ffukyg(fptr, "BZERO", 2147483648., 0, comment, status);
        strcpy(comment, "default scaling factor");
        ffukyg(fptr, "BSCALE", 1.0, 0, comment, status);
    }
    else if (bitpix == ULONGLONG_IMG)
    {
        strcpy(comment, "offset data range to that of unsigned long long");
        ffukyg(fptr, "BZERO", 9223372036854775808., 0, comment, status);
        strcpy(comment, "default scaling factor");
        ffukyg(fptr, "BSCALE", 1.0, 0, comment, status);
    }
    else if (bitpix == SBYTE_IMG)
    {
        strcpy(comment, "offset data range to that of signed byte");
        ffukyg(fptr, "BZERO", -128., 0, comment, status);
        strcpy(comment, "default scaling factor");
        ffukyg(fptr, "BSCALE", 1.0, 0, comment, status);
    }

    /* re-read the header, to make sure structures are updated */
    ffrdef(fptr, status);
    return(*status);
}